

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

bool __thiscall tinyxml2::XMLDeclaration::ShallowEqual(XMLDeclaration *this,XMLNode *compare)

{
  int iVar1;
  undefined4 extraout_var;
  char *p;
  char *q;
  bool local_21;
  XMLDeclaration *declaration;
  XMLNode *compare_local;
  XMLDeclaration *this_local;
  
  iVar1 = (*compare->_vptr_XMLNode[10])();
  local_21 = false;
  if ((XMLNode *)CONCAT44(extraout_var,iVar1) != (XMLNode *)0x0) {
    p = XMLNode::Value((XMLNode *)CONCAT44(extraout_var,iVar1));
    q = XMLNode::Value(&this->super_XMLNode);
    local_21 = XMLUtil::StringEqual(p,q,0x7fffffff);
  }
  return local_21;
}

Assistant:

bool XMLDeclaration::ShallowEqual( const XMLNode* compare ) const
{
    TIXMLASSERT( compare );
    const XMLDeclaration* declaration = compare->ToDeclaration();
    return ( declaration && XMLUtil::StringEqual( declaration->Value(), Value() ));
}